

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

int CreateBloodTranslation(PalEntry color)

{
  uint g;
  uint b;
  byte bVar1;
  BYTE BVar2;
  uint uVar3;
  ulong uVar4;
  FRemapTable *this;
  byte bVar5;
  long lVar6;
  PalEntry color_local;
  FRemapTablePtr local_38;
  
  color_local.field_0 = color.field_0;
  if (BloodTranslationColors.Count == 0) {
    local_38.Ptr = (FRemapTable *)0x0;
    TArray<FRemapTablePtr,_FRemapTable_*>::Push
              (&translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>,&local_38);
    local_38.Ptr = local_38.Ptr & 0xffffffff00000000;
    TArray<PalEntry,_PalEntry>::Push(&BloodTranslationColors,(PalEntry *)&local_38);
  }
  for (uVar4 = 1; uVar4 < BloodTranslationColors.Count; uVar4 = uVar4 + 1) {
    if (((BloodTranslationColors.Array[uVar4].field_0.field_0.r == color.field_0._2_1_) &&
        (BloodTranslationColors.Array[uVar4].field_0.field_0.g == color.field_0._1_1_)) &&
       (BloodTranslationColors.Array[uVar4].field_0.field_0.b == color.field_0._0_1_))
    goto LAB_00351510;
  }
  if (0xfffe < BloodTranslationColors.Count) {
    I_Error("Too many blood colors");
  }
  this = (FRemapTable *)operator_new(0x20);
  FRemapTable::FRemapTable(this,0x100);
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    bVar1 = GPalette.BaseColors[lVar6].field_0.field_0.r;
    bVar5 = GPalette.BaseColors[lVar6].field_0.field_0.g;
    if (bVar5 < bVar1) {
      bVar5 = bVar1;
    }
    bVar1 = (*(anon_union_4_2_12391d7c_for_PalEntry_0 *)&GPalette.BaseColors[lVar6].field_0.field_0)
            .b;
    if (bVar5 <= bVar1) {
      bVar5 = bVar1;
    }
    uVar3 = (((uint)color.field_0 >> 0x10 & 0xff) * (uint)bVar5) / 0xff;
    g = (((uint)color.field_0 >> 8 & 0xff) * (uint)bVar5) / 0xff;
    b = ((uint)bVar5 * ((uint)color.field_0 & 0xff)) / 0xff;
    BVar2 = FColorMatcher::Pick(&ColorMatcher,uVar3,g,b);
    this->Palette[lVar6].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)(g << 8 | uVar3 << 0x10 | b);
    this->Remap[lVar6] = BVar2;
  }
  local_38.Ptr = this;
  TArray<FRemapTablePtr,_FRemapTable_*>::Push
            (&translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>,&local_38);
  uVar3 = TArray<PalEntry,_PalEntry>::Push(&BloodTranslationColors,&color_local);
  uVar4 = (ulong)uVar3;
LAB_00351510:
  return (int)uVar4;
}

Assistant:

int CreateBloodTranslation(PalEntry color)
{
	unsigned int i;

	if (BloodTranslationColors.Size() == 0)
	{
		// Don't use the first slot.
		translationtables[TRANSLATION_Blood].Push(NULL);
		BloodTranslationColors.Push(0);
	}

	for (i = 1; i < BloodTranslationColors.Size(); i++)
	{
		if (color.r == BloodTranslationColors[i].r &&
			color.g == BloodTranslationColors[i].g &&
			color.b == BloodTranslationColors[i].b)
		{
			// A duplicate of this translation already exists
			return i;
		}
	}
	if (BloodTranslationColors.Size() >= MAX_DECORATE_TRANSLATIONS)
	{
		I_Error("Too many blood colors");
	}
	FRemapTable *trans = new FRemapTable;
	for (i = 0; i < 256; i++)
	{
		int bright = MAX(MAX(GPalette.BaseColors[i].r, GPalette.BaseColors[i].g), GPalette.BaseColors[i].b);
		PalEntry pe = PalEntry(color.r*bright/255, color.g*bright/255, color.b*bright/255);
		int entry = ColorMatcher.Pick(pe.r, pe.g, pe.b);

		trans->Palette[i] = pe;
		trans->Remap[i] = entry;
	}
	translationtables[TRANSLATION_Blood].Push(trans);
	return BloodTranslationColors.Push(color);
}